

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadBodyInertia::ChLoadBodyInertia
          (ChLoadBodyInertia *this,shared_ptr<chrono::ChBody> *body,ChVector<double> *m_offset,
          double m_mass,ChVector<double> *m_IXX,ChVector<double> *m_IXY)

{
  element_type *peVar1;
  shared_ptr<chrono::ChLoadable> local_38;
  double local_28;
  
  peVar1 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[-3] + -0x78 +
         (long)(&(peVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
               + 0xffffffffffffffff) + 0x30);
  }
  local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_28 = m_mass;
  ChLoadCustom::ChLoadCustom(&this->super_ChLoadCustom,&local_38);
  if (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoadCustom).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustom_00b48e58;
  (this->c_m).m_data[0] = m_offset->m_data[0];
  (this->c_m).m_data[1] = m_offset->m_data[1];
  (this->c_m).m_data[2] = m_offset->m_data[2];
  this->mass = local_28;
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       m_IXX->m_data[0];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       m_IXX->m_data[1];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       m_IXX->m_data[2];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       m_IXY->m_data[0];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       m_IXY->m_data[1];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       m_IXY->m_data[2];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       m_IXY->m_data[0];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       m_IXY->m_data[1];
  (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       m_IXY->m_data[2];
  return;
}

Assistant:

ChLoadBodyInertia::ChLoadBodyInertia(std::shared_ptr<ChBody> body,  ///< object to apply additional inertia to
    const ChVector<>& m_offset,      ///< offset of the center of mass, in body coordinate system
    const double m_mass,             ///< added mass [kg]
    const ChVector<>& m_IXX,         ///< added diag. inertia values Ixx, Iyy, Izz (in body coordinate system, centered in body)
    const ChVector<>& m_IXY) 
    : ChLoadCustom(body), c_m(m_offset), mass(m_mass)
{
    this->SetInertiaXX(m_IXX);
    this->SetInertiaXY(m_IXY);
}